

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O3

void add_timespec(timespec *ts,int64 addtime)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = addtime / 1000000000 + ts->tv_sec;
  ts->tv_sec = lVar1;
  uVar2 = addtime % 1000000000 + ts->tv_nsec;
  ts->tv_nsec = uVar2;
  if (1000000000 < (long)uVar2) {
    ts->tv_sec = uVar2 / 1000000000 + lVar1;
    ts->tv_nsec = uVar2 % 1000000000;
  }
  return;
}

Assistant:

void add_timespec(struct timespec *ts, int64 addtime)
{
   int64 sec, nsec;
   
   nsec = addtime % NSEC_PER_SEC;
   sec = (addtime - nsec) / NSEC_PER_SEC;
   ts->tv_sec += sec;
   ts->tv_nsec += nsec;
   if ( ts->tv_nsec > NSEC_PER_SEC ) 
   { 
      nsec = ts->tv_nsec % NSEC_PER_SEC;
      ts->tv_sec += (ts->tv_nsec - nsec) / NSEC_PER_SEC;
      ts->tv_nsec = nsec;
   }   
}